

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

EGLContext glfwGetEGLContext(GLFWwindow *handle)

{
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x200) != 0) {
      return *(EGLContext *)(handle + 0x290);
    }
    code = 0x1000a;
  }
  _glfwInputError(code,(char *)0x0);
  return (EGLContext)0x0;
}

Assistant:

GLFWAPI EGLContext glfwGetEGLContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_CONTEXT);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_CONTEXT;
    }

    return window->context.egl.handle;
}